

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

fxp_name * fxp_dup_name(fxp_name *name)

{
  uint64_t uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  fxp_name *pfVar6;
  char *pcVar7;
  
  pfVar6 = (fxp_name *)safemalloc(1,0x48,0);
  pcVar7 = dupstr(name->filename);
  pfVar6->filename = pcVar7;
  pcVar7 = dupstr(name->longname);
  pfVar6->longname = pcVar7;
  uVar1 = (name->attrs).size;
  uVar2 = (name->attrs).uid;
  uVar3 = (name->attrs).gid;
  uVar4 = (name->attrs).permissions;
  uVar5 = (name->attrs).atime;
  (pfVar6->attrs).flags = (name->attrs).flags;
  (pfVar6->attrs).size = uVar1;
  (pfVar6->attrs).uid = uVar2;
  (pfVar6->attrs).gid = uVar3;
  (pfVar6->attrs).permissions = uVar4;
  (pfVar6->attrs).atime = uVar5;
  (pfVar6->attrs).mtime = (name->attrs).mtime;
  return pfVar6;
}

Assistant:

struct fxp_name *fxp_dup_name(struct fxp_name *name)
{
    struct fxp_name *ret;
    ret = snew(struct fxp_name);
    ret->filename = dupstr(name->filename);
    ret->longname = dupstr(name->longname);
    ret->attrs = name->attrs;          /* structure copy */
    return ret;
}